

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffdblk(fitsfile *fptr,long nblocks,int *status)

{
  long bytepos;
  FITSfile *pFVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  int tstatus;
  char buffer [2880];
  int local_b7c;
  undefined1 local_b78 [2888];
  
  iVar2 = *status;
  if (0 < nblocks && iVar2 < 1) {
    local_b7c = 0;
    pFVar1 = fptr->Fptr;
    lVar3 = pFVar1->heapstart + pFVar1->datastart + pFVar1->heapsize + 0xb3f;
    lVar3 = lVar3 - lVar3 % 0xb40;
    while( true ) {
      bytepos = nblocks * -0xb40 + lVar3;
      iVar2 = ffmbyt(fptr,lVar3,0,&local_b7c);
      if (iVar2 != 0) break;
      iVar2 = ffgbyt(fptr,0xb40,local_b78,&local_b7c);
      if (iVar2 != 0) break;
      ffmbyt(fptr,bytepos,0,status);
      ffpbyt(fptr,0xb40,local_b78,status);
      if (0 < *status) {
        ffpmsg("Error deleting FITS blocks (ffdblk)");
        goto LAB_0014291d;
      }
      lVar3 = lVar3 + 0xb40;
    }
    memset(local_b78,0,0xb40);
    ffmbyt(fptr,bytepos,0,status);
    lVar4 = nblocks;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      ffpbyt(fptr,0xb40,local_b78,status);
    }
    ffmbyt(fptr,nblocks * -0xb40 + lVar3 + -1,0,status);
    fftrun(fptr,bytepos,status);
    pFVar1 = fptr->Fptr;
    iVar2 = pFVar1->maxhdu;
    for (lVar3 = (long)pFVar1->curhdu; lVar3 <= iVar2; lVar3 = lVar3 + 1) {
      pFVar1->headstart[lVar3 + 1] = pFVar1->headstart[lVar3 + 1] + nblocks * -0xb40;
    }
LAB_0014291d:
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffdblk(fitsfile *fptr,      /* I - FITS file pointer                    */
           long nblocks,        /* I - number of 2880-byte blocks to delete */
           int *status)         /* IO - error status                        */
/*
  Delete the specified number of 2880-byte blocks from the end
  of the CHDU by shifting all following extensions up this 
  number of blocks.
*/
{
    char buffer[2880];
    int tstatus, ii;
    LONGLONG readpos, writepos;

    if (*status > 0 || nblocks <= 0)
        return(*status);

    tstatus = 0;
    /* pointers to the read and write positions */

    readpos = (fptr->Fptr)->datastart + 
                   (fptr->Fptr)->heapstart + 
                   (fptr->Fptr)->heapsize;
    readpos = ((readpos + 2879) / 2880) * 2880; /* start of block */

/*  the following formula is wrong because the current data unit
    may have been extended without updating the headstart value
    of the following HDU.
    
    readpos = (fptr->Fptr)->headstart[((fptr->Fptr)->curhdu) + 1];
*/
    writepos = readpos - ((LONGLONG)nblocks * 2880);

    while ( !ffmbyt(fptr, readpos, REPORT_EOF, &tstatus) &&
            !ffgbyt(fptr, 2880L, buffer, &tstatus) )
    {
        ffmbyt(fptr, writepos, REPORT_EOF, status);
        ffpbyt(fptr, 2880L, buffer, status);

        if (*status > 0)
        {
           ffpmsg("Error deleting FITS blocks (ffdblk)");
           return(*status);
        }
        readpos  += 2880;  /* increment to next block to transfer */
        writepos += 2880;
    }

    /* now fill the last nblock blocks with zeros */
    memset(buffer, 0, 2880);
    ffmbyt(fptr, writepos, REPORT_EOF, status);

    for (ii = 0; ii < nblocks; ii++)
        ffpbyt(fptr, 2880L, buffer, status);

    /* move back before the deleted blocks, since they may be deleted */
    /*   and we do not want to delete the current active buffer */
    ffmbyt(fptr, writepos - 1, REPORT_EOF, status);

    /* truncate the file to the new size, if supported on this device */
    fftrun(fptr, writepos, status);

    /* recalculate the starting location of all subsequent HDUs */
    for (ii = (fptr->Fptr)->curhdu; ii <= (fptr->Fptr)->maxhdu; ii++)
         (fptr->Fptr)->headstart[ii + 1] -= ((LONGLONG)nblocks * 2880);

    return(*status);
}